

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O1

bool aeron::util::MemoryMappedFile::fill(FileHandle fd,size_t size,uint8_t value)

{
  void *__s;
  ulong uVar1;
  size_t sVar2;
  undefined7 in_register_00000011;
  bool bVar3;
  
  uVar1 = m_page_size;
  __s = operator_new__(m_page_size);
  memset(__s,(int)CONCAT71(in_register_00000011,value),uVar1);
  if (uVar1 <= size) {
    do {
      uVar1 = write(fd.handle,__s,uVar1);
      if (uVar1 != m_page_size) goto LAB_0014a352;
      size = size - m_page_size;
      uVar1 = m_page_size;
    } while (m_page_size <= size);
  }
  if (size != 0) {
    sVar2 = write(fd.handle,__s,size);
    if (sVar2 != size) {
LAB_0014a352:
      bVar3 = false;
      goto LAB_0014a354;
    }
  }
  bVar3 = true;
LAB_0014a354:
  operator_delete__(__s);
  return bVar3;
}

Assistant:

bool MemoryMappedFile::fill(FileHandle fd, size_t size, uint8_t value)
{
    std::unique_ptr<uint8_t[]> buffer(new uint8_t[m_page_size]);
    memset(buffer.get(), value, m_page_size);

    while (size >= m_page_size)
    {
        if (static_cast<size_t>(write(fd.handle, buffer.get(), m_page_size)) != m_page_size)
        {
            return false;
        }

        size -= m_page_size;
    }

    if (size)
    {
        if (static_cast<size_t>(write(fd.handle, buffer.get(), size)) != size)
        {
            return false;
        }
    }
    return true;
}